

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_rb_struct_required_validator
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  string *psVar1;
  undefined1 *puVar2;
  t_field *ptVar3;
  int iVar4;
  t_rb_ofstream *ptVar5;
  ostream *poVar6;
  pointer pptVar7;
  pointer pptVar8;
  string local_50;
  
  ptVar5 = t_rb_ofstream::indent(out);
  poVar6 = std::operator<<((ostream *)ptVar5,"def validate");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  puVar2 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar2 = *(int *)puVar2 + 1;
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    ptVar3 = *pptVar8;
    if (ptVar3->req_ == T_REQUIRED) {
      ptVar5 = t_rb_ofstream::indent(out);
      poVar6 = std::operator<<((ostream *)ptVar5,
                               "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Required field "
                              );
      psVar1 = &ptVar3->name_;
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      std::operator<<(poVar6," is unset!\')");
      iVar4 = (*(ptVar3->type_->super_t_doc)._vptr_t_doc[8])();
      if ((char)iVar4 == '\0') {
        poVar6 = std::operator<<((ostream *)out," unless @");
        std::operator<<(poVar6,(string *)psVar1);
      }
      else {
        poVar6 = std::operator<<((ostream *)out," if @");
        poVar6 = std::operator<<(poVar6,(string *)psVar1);
        std::operator<<(poVar6,".nil?");
      }
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    }
  }
  for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar7 != pptVar8; pptVar7 = pptVar7 + 1
      ) {
    ptVar3 = *pptVar7;
    iVar4 = (*(ptVar3->type_->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar4 != '\0') {
      ptVar5 = t_rb_ofstream::indent(out);
      poVar6 = std::operator<<((ostream *)ptVar5,"unless @");
      psVar1 = &ptVar3->name_;
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      poVar6 = std::operator<<(poVar6,".nil? || ");
      full_type_name_abi_cxx11_(&local_50,this,ptVar3->type_);
      poVar6 = std::operator<<(poVar6,(string *)&local_50);
      poVar6 = std::operator<<(poVar6,"::VALID_VALUES.include?(@");
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      poVar6 = std::operator<<(poVar6,")");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      puVar2 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
      *(int *)puVar2 = *(int *)puVar2 + 1;
      ptVar5 = t_rb_ofstream::indent(out);
      poVar6 = std::operator<<((ostream *)ptVar5,
                               "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Invalid value of field "
                              );
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      poVar6 = std::operator<<(poVar6,"!\')");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      puVar2 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
      *(int *)puVar2 = *(int *)puVar2 + -1;
      ptVar5 = t_rb_ofstream::indent(out);
      poVar6 = std::operator<<((ostream *)ptVar5,"end");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  puVar2 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar2 = *(int *)puVar2 + -1;
  ptVar5 = t_rb_ofstream::indent(out);
  poVar6 = std::operator<<((ostream *)ptVar5,"end");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_required_validator(t_rb_ofstream& out, t_struct* tstruct) {
  out.indent() << "def validate" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    if (field->get_req() == t_field::T_REQUIRED) {
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Required field " << field->get_name() << " is unset!')";
      if (field->get_type()->is_bool()) {
        out << " if @" << field->get_name() << ".nil?";
      } else {
        out << " unless @" << field->get_name();
      }
      out << endl;
    }
  }

  // if field is an enum, check that its value is valid
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);

    if (field->get_type()->is_enum()) {
      out.indent() << "unless @" << field->get_name() << ".nil? || "
                   << full_type_name(field->get_type()) << "::VALID_VALUES.include?(@"
                   << field->get_name() << ")" << endl;
      out.indent_up();
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Invalid value of field " << field->get_name() << "!')" << endl;
      out.indent_down();
      out.indent() << "end" << endl;
    }
  }

  out.indent_down();
  out.indent() << "end" << endl << endl;
}